

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

bool __thiscall slang::ConstantRange::contains(ConstantRange *this,ConstantRange other)

{
  int32_t iVar1;
  int32_t iVar2;
  undefined1 local_11;
  
  iVar1 = lower((ConstantRange *)0x3365f2);
  iVar2 = lower((ConstantRange *)0x336600);
  local_11 = false;
  if (iVar2 <= iVar1) {
    iVar1 = upper((ConstantRange *)0x33661a);
    iVar2 = upper((ConstantRange *)0x336628);
    local_11 = iVar1 <= iVar2;
  }
  return local_11;
}

Assistant:

bool ConstantRange::contains(ConstantRange other) const {
    return other.lower() >= lower() && other.upper() <= upper();
}